

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O1

void __thiscall MainWindow::trayIconContextMenu(MainWindow *this)

{
  undefined8 uVar1;
  QMenu *this_00;
  QAction *pQVar2;
  QSettings *pQVar3;
  QSystemTrayIcon *pQVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QFont boldFont;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  QObject local_38 [8];
  QFont local_30 [16];
  
  this_00 = (QMenu *)operator_new(0x28);
  QMenu::QMenu(this_00,(QWidget *)this);
  QVar5.m_data = (storage_type *)0x15;
  QVar5.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar5);
  local_98.shared = local_78.shared;
  local_98._8_8_ = local_78._8_8_;
  local_98._16_8_ = local_78._16_8_;
  QKeySequence::QKeySequence((QKeySequence *)local_78.data);
  pQVar2 = (QAction *)
           QMenu::addAction((QString *)this_00,(QObject *)local_98.data,(char *)this,
                            (QKeySequence *)"1showHideMainWindow()");
  this->trayIconMenuShowHideMainWindow = pQVar2;
  QKeySequence::~QKeySequence((QKeySequence *)local_78.data);
  if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_98.shared = *(int *)local_98.shared + -1;
    UNLOCK();
    if (*(int *)local_98.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_98.shared,2,8);
    }
  }
  QAction::font();
  QFont::setWeight((Weight)local_30);
  QAction::setFont((QFont *)this->trayIconMenuShowHideMainWindow);
  QVar6.m_data = (storage_type *)0x1a;
  QVar6.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar6);
  local_98.shared = local_78.shared;
  local_98._8_8_ = local_78._8_8_;
  local_98._16_8_ = local_78._16_8_;
  QKeySequence::QKeySequence((QKeySequence *)local_78.data);
  pQVar2 = (QAction *)
           QMenu::addAction((QString *)this_00,(QObject *)local_98.data,(char *)this,
                            (QKeySequence *)"1showHideFloatingDisplay()");
  this->trayIconMenuShowHideFloatingDisplay = pQVar2;
  QKeySequence::~QKeySequence((QKeySequence *)local_78.data);
  if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_98.shared = *(int *)local_98.shared + -1;
    UNLOCK();
    if (*(int *)local_98.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_98.shared,2,8);
    }
  }
  QVar7.m_data = (storage_type *)0x10;
  QVar7.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar7);
  local_98.shared = local_78.shared;
  local_98._8_8_ = local_78._8_8_;
  local_98._16_8_ = local_78._16_8_;
  QKeySequence::QKeySequence((QKeySequence *)local_78.data);
  QMenu::addAction((QString *)this_00,(QObject *)local_98.data,(char *)this,
                   (QKeySequence *)"1on_actionPlay_MIDI_file_triggered()");
  QKeySequence::~QKeySequence((QKeySequence *)local_78.data);
  if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_98.shared = *(int *)local_98.shared + -1;
    UNLOCK();
    if (*(int *)local_98.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_98.shared,2,8);
    }
  }
  QWidget::addAction((QAction *)this_00);
  uVar1 = *(undefined8 *)(this->ui + 0x20);
  pQVar3 = Master::getSettings(this->master);
  QVar8.m_data = (storage_type *)0x14;
  QVar8.m_size = (qsizetype)&local_98;
  QString::fromUtf8(QVar8);
  local_58 = (QArrayData *)local_98.shared;
  uStack_50 = local_98._8_8_;
  local_48 = local_98._16_8_;
  QVariant::QVariant((QVariant *)&local_98,false);
  QSettings::value((QString *)local_78.data,(QVariant *)pQVar3);
  QVariant::toBool();
  QAction::setChecked(SUB81(uVar1,0));
  QVariant::~QVariant((QVariant *)&local_78);
  QVariant::~QVariant((QVariant *)&local_98);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  QVar9.m_data = (storage_type *)0x4;
  QVar9.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar9);
  local_98.shared = local_78.shared;
  local_98._8_8_ = local_78._8_8_;
  local_98._16_8_ = local_78._16_8_;
  QKeySequence::QKeySequence((QKeySequence *)local_78.data);
  QMenu::addAction((QString *)this_00,(QObject *)local_98.data,(char *)this,
                   (QKeySequence *)"1on_actionExit_triggered()");
  QKeySequence::~QKeySequence((QKeySequence *)local_78.data);
  if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_98.shared = *(int *)local_98.shared + -1;
    UNLOCK();
    if (*(int *)local_98.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_98.shared,2,8);
    }
  }
  QObject::connect(local_38,(char *)this_00,(QObject *)"2aboutToShow()",(char *)this,0x18d520);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pQVar4 = Master::getTrayIcon(this->master);
  QSystemTrayIcon::setContextMenu((QMenu *)pQVar4);
  QFont::~QFont(local_30);
  return;
}

Assistant:

void MainWindow::trayIconContextMenu() {
	QMenu *menu = new QMenu(this);

	trayIconMenuShowHideMainWindow = menu->addAction("Show/Hide Main Window", this, SLOT(showHideMainWindow()));
	QFont boldFont(trayIconMenuShowHideMainWindow->font());
	boldFont.setBold(true);
	trayIconMenuShowHideMainWindow->setFont(boldFont);

	trayIconMenuShowHideFloatingDisplay = menu->addAction("Show/Hide Floating Display", this, SLOT(showHideFloatingDisplay()));

	menu->addAction("Show MIDI Player", this, SLOT(on_actionPlay_MIDI_file_triggered()));

	menu->addAction(ui->actionStart_iconized);
	ui->actionStart_iconized->setChecked(master->getSettings()->value("Master/startIconized", false).toBool());

#ifdef WITH_WINCONSOLE
	QAction *a = menu->addAction("Show console", this, SLOT(toggleShowConsole()));
	a->setCheckable(true);
	a->setChecked(master->getSettings()->value("Master/showConsole", false).toBool());
#endif

	menu->addAction("Exit", this, SLOT(on_actionExit_triggered()));

	connect(menu, SIGNAL(aboutToShow()), SLOT(handleTrayIconMenuAboutToShow()));
	master->getTrayIcon()->setContextMenu(menu);
}